

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

bool __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>::
can_be_inserted(storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>
                *this,size_t hash,int constraints)

{
  pointer prVar1;
  long lVar2;
  bool bVar3;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  bVar3 = (ulong)(uint)this->m_size == 0;
  if (!bVar3) {
    prVar1 = (this->m_data).
             super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = 0;
    do {
      if ((*(int *)((long)&prVar1->remaining_constraints + lVar2) == constraints) &&
         (*(size_t *)((long)&prVar1->hash + lVar2) == hash)) break;
      lVar2 = lVar2 + 0x38;
      bVar3 = (ulong)(uint)this->m_size * 0x38 - lVar2 == 0;
    } while (!bVar3);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return bVar3;
}

Assistant:

bool can_be_inserted(const std::size_t hash, const int constraints) const
      noexcept
    {
        m_indices_reader lock(m_indices_mutex);

        for (int i = 0; i != m_size; ++i)
            if (m_data[i].remaining_constraints == constraints &&
                m_data[i].hash == hash)
                return false;

        return true;
    }